

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

TLVWriter * __thiscall ASDCP::MXF::TLVWriter::WriteUi8(TLVWriter *this,MDDEntry *Entry,ui8_t *value)

{
  bool bVar1;
  int iVar2;
  ui8_t *in_RCX;
  undefined1 local_90 [8];
  Result_t result;
  ui8_t *value_local;
  MDDEntry *Entry_local;
  TLVWriter *this_local;
  
  if (in_RCX == (ui8_t *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  WriteTag((TLVWriter *)local_90,Entry);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_90);
  if (-1 < iVar2) {
    bVar1 = Kumu::MemIOWriter::WriteUi16BE((MemIOWriter *)Entry,1);
    if (!bVar1) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00231749;
    }
    bVar1 = Kumu::MemIOWriter::WriteUi8((MemIOWriter *)Entry,*in_RCX);
    if (!bVar1) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00231749;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_90);
LAB_00231749:
  Kumu::Result_t::~Result_t((Result_t *)local_90);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteUi8(const MDDEntry& Entry, ui8_t* value)
{
  ASDCP_TEST_NULL(value);
  Result_t result = WriteTag(Entry);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( ! MemIOWriter::WriteUi16BE(sizeof(ui8_t)) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
      if ( ! MemIOWriter::WriteUi8(*value) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
    }
  
  return result;
}